

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void nni_stat_set_value(nni_stat_item *item,uint64_t v)

{
  uint64_t v_local;
  nni_stat_item *item_local;
  
  if ((item->si_info->field_0x18 & 1) == 0) {
    (item->si_u).sv_number = v;
  }
  else {
    nni_atomic_set64(&(item->si_u).sv_atomic,v);
  }
  return;
}

Assistant:

void
nni_stat_set_value(nni_stat_item *item, uint64_t v)
{
#ifdef NNG_ENABLE_STATS
	if (item->si_info->si_atomic) {
		nni_atomic_set64(&item->si_u.sv_atomic, v);
	} else {
		item->si_u.sv_number = v;
	}
#else
	NNI_ARG_UNUSED(item);
	NNI_ARG_UNUSED(v);
#endif
}